

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall pbrt::ParsedParameter::AddString(ParsedParameter *this,string_view str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->bools).nStored == 0 && (this->numbers).nStored == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,str._M_str,str._M_str + str._M_len);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->strings,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  LogFatal<char_const(&)[33]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
             ,0x31,"Check failed: %s",(char (*) [33])"numbers.empty() && bools.empty()");
}

Assistant:

void ParsedParameter::AddString(std::string_view str) {
    CHECK(numbers.empty() && bools.empty());
    strings.push_back({str.begin(), str.end()});
}